

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_LDI(void)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  Z80Reg ZVar4;
  Z80Reg ZVar5;
  EBracketType EVar6;
  int iVar7;
  undefined1 signedCheck;
  undefined8 in_RSI;
  char **ppcVar8;
  int e [14];
  
  ppcVar8 = (char **)0x0;
  bVar1 = Options::noFakes(false);
  if (bVar1) {
    EmitByte(0xed,true);
    EmitByte(0xa0,false);
    return;
  }
  do {
    signedCheck = (undefined1)in_RSI;
    e[8] = -1;
    e[9] = -1;
    e[10] = -1;
    e[0xb] = -1;
    e[4] = -1;
    e[5] = -1;
    e[6] = -1;
    e[7] = -1;
    e[0] = -1;
    e[1] = -1;
    e[2] = -1;
    e[3] = -1;
    e[0xc] = -1;
    e[0xd] = -1;
    ZVar4 = GetRegister(ppcVar8);
    switch(ZVar4) {
    case Z80_B:
    case Z80_C:
    case Z80_D:
    case Z80_E:
    case Z80_H:
    case Z80_L:
      bVar1 = comma(&lp);
      if ((bVar1) && (EVar6 = OpenBracket(&lp), EVar6 != BT_NONE)) {
        ppcVar8 = (char **)0x1;
        Options::noFakes(true);
        ZVar5 = GetRegister(ppcVar8);
        if ((ZVar5 == Z80_IY) || (ZVar5 == Z80_IX)) {
          e[3] = -2;
          e[1] = ZVar4 * 8 + 0x46;
          e[5] = 0x23;
          bVar2 = z80GetIDxoffset(ppcVar8);
          e[2] = (int)bVar2;
          iVar7 = CloseBracket(&lp);
          if (iVar7 != 0) {
            e[0] = ZVar5;
            e[4] = ZVar5;
          }
        }
        else if (ZVar5 == Z80_HL) {
          e[1] = -2;
          e[2] = 0x23;
          iVar7 = CloseBracket(&lp);
          if (iVar7 != 0) {
            e[0] = ZVar4 * 8 + 0x46;
          }
        }
      }
      break;
    case Z80_MEM_HL:
      ppcVar8 = &lp;
      bVar1 = comma(&lp);
      if (bVar1) {
        ZVar4 = GetRegister(ppcVar8);
        switch(ZVar4) {
        case Z80_B:
        case Z80_C:
        case Z80_D:
        case Z80_E:
        case Z80_H:
        case Z80_L:
        case Z80_A:
          Options::noFakes(true);
          e[1] = -2;
          e[2] = 0x23;
          ZVar4 = ZVar4 + (Z80_SP|Z80_HL);
          ZVar5 = e[4];
LAB_001341de:
          e[4] = ZVar5;
          e[0] = ZVar4;
          break;
        case Z80_MEM_HL:
        case Z80_I:
        case Z80_R:
        case Z80_F:
        case Z80_F|Z80_C:
        case Z80_I|Z80_H:
        case Z80_I|Z80_L:
        case Z80_I|Z80_MEM_HL:
        case Z80_I|Z80_A:
          break;
        case Z80_BC:
switchD_001341c2_caseD_10:
          Options::noFakes(true);
          e[1] = -2;
          e[5] = -2;
          e[3] = e[1];
          ZVar5 = GetRegister_r16Low(ZVar4);
          e[0] = ZVar5 + (Z80_SP|Z80_HL);
          ZVar4 = GetRegister_r16High(ZVar4);
          e[2] = 0x23;
          e[4] = ZVar4 + (Z80_SP|Z80_HL);
          e[6] = 0x23;
          break;
        case Z80_UNK:
          Options::noFakes(true);
          e[2] = -2;
          e[0] = 0x36;
          bVar2 = GetByteNoMem((char **)0x0,(bool)signedCheck);
          e[1] = (int)bVar2;
          e[3] = 0x23;
          break;
        default:
          if (ZVar4 == Z80_DE) goto switchD_001341c2_caseD_10;
        }
      }
      break;
    case Z80_A:
      bVar1 = comma(&lp);
      if ((bVar1) && (EVar6 = OpenBracket(&lp), EVar6 != BT_NONE)) {
        ppcVar8 = (char **)0x1;
        Options::noFakes(true);
        ZVar4 = GetRegister(ppcVar8);
        if (ZVar4 == Z80_BC) {
LAB_00134166:
          iVar7 = CloseBracket(&lp);
          if (iVar7 != 0) {
            e[0] = ZVar4 + ~Z80_L;
          }
LAB_00134181:
          e[1] = -2;
          e[2] = ZVar4 + ~(Z80_I|Z80_H);
        }
        else if (ZVar4 == Z80_IY) {
LAB_0013431d:
          e[3] = -2;
          e[1] = 0x7e;
          e[5] = 0x23;
          bVar2 = z80GetIDxoffset(ppcVar8);
          e[2] = (int)bVar2;
          iVar7 = CloseBracket(&lp);
          ZVar5 = ZVar4;
          if (iVar7 != 0) goto LAB_001341de;
        }
        else if (ZVar4 == Z80_HL) {
          e[1] = -2;
          e[2] = 0x23;
          iVar7 = CloseBracket(&lp);
          if (iVar7 != 0) {
            e[0] = 0x7e;
          }
        }
        else {
          if (ZVar4 == Z80_IX) goto LAB_0013431d;
          if (ZVar4 == Z80_DE) goto LAB_00134166;
        }
      }
      break;
    case Z80_I:
    case Z80_R:
    case Z80_F:
    case Z80_F|Z80_C:
    case Z80_I|Z80_H:
    case Z80_I|Z80_L:
    case Z80_I|Z80_MEM_HL:
    case Z80_I|Z80_A:
switchD_00133efe_caseD_8:
      ppcVar8 = &lp;
      EVar6 = OpenBracket(&lp);
      if (EVar6 == BT_NONE) {
        e[0] = 0xed;
        e[1] = 0xa0;
      }
      else {
        ZVar4 = GetRegister(ppcVar8);
        iVar7 = CloseBracket(&lp);
        if (iVar7 != 0) {
          ppcVar8 = &lp;
          bVar1 = comma(&lp);
          if ((bVar1) &&
             (((ZVar4 == Z80_DE || (ZVar4 == Z80_BC)) &&
              (ZVar5 = GetRegister(ppcVar8), ZVar5 == Z80_A)))) {
            Options::noFakes(true);
            e[0] = ZVar4 + ~(Z80_I|Z80_L);
            goto LAB_00134181;
          }
        }
      }
      break;
    case Z80_BC:
switchD_00133efe_caseD_10:
      ppcVar8 = &lp;
      bVar1 = comma(&lp);
      if (bVar1) {
        ZVar5 = GetRegister(ppcVar8);
        if ((ZVar5 == Z80_MEM_IY) || (ZVar5 == Z80_MEM_IX)) {
          Options::noFakes(true);
          e[3] = -2;
          e[9] = GetRegister_lastIxyD;
          e[2] = GetRegister_lastIxyD;
          e[7] = ZVar5 & 0xff;
          e[1] = ZVar4 + (Z80_HL|Z80_I|Z80_MEM_HL);
          e[8] = ZVar4 + (Z80_HL|Z80_MEM_HL);
          e[0xc] = 0x23;
          e[5] = 0x23;
          e[6] = -2;
          e[0] = e[7];
          e[4] = e[7];
          e[10] = e[3];
          e[0xb] = e[7];
        }
        else if ((ZVar5 == Z80_MEM_HL) && (ZVar4 != Z80_HL)) {
          Options::noFakes(true);
          e[5] = -2;
          e[6] = 0x23;
          e[3] = -2;
          e[1] = -2;
          e[2] = 0x23;
          e[0] = ZVar4 + (Z80_HL|Z80_I|Z80_MEM_HL);
          e[4] = ZVar4 + (Z80_HL|Z80_MEM_HL);
        }
      }
      break;
    default:
      if ((ZVar4 == Z80_DE) || (ZVar4 == Z80_HL)) goto switchD_00133efe_caseD_10;
      if ((ZVar4 != Z80_MEM_IX) && (ZVar4 != Z80_MEM_IY)) goto switchD_00133efe_caseD_8;
      ppcVar8 = &lp;
      bVar1 = comma(&lp);
      if (bVar1) {
        ZVar5 = GetRegister(ppcVar8);
        switch(ZVar5) {
        case Z80_B:
        case Z80_C:
        case Z80_D:
        case Z80_E:
        case Z80_H:
        case Z80_L:
        case Z80_A:
          Options::noFakes(true);
          e[3] = -2;
          e[0] = ZVar4 & 0xff;
          e[2] = GetRegister_lastIxyD;
          e[1] = ZVar5 + (Z80_SP|Z80_HL);
          e[5] = 0x23;
          e[4] = e[0];
          break;
        case Z80_MEM_HL:
        case Z80_I:
        case Z80_R:
        case Z80_F:
        case Z80_F|Z80_C:
        case Z80_I|Z80_H:
        case Z80_I|Z80_L:
        case Z80_I|Z80_MEM_HL:
        case Z80_I|Z80_A:
          break;
        case Z80_BC:
switchD_00133fde_caseD_10:
          Options::noFakes(true);
          e[3] = -2;
          e[0] = ZVar4 & 0xff;
          e[0xc] = 0x23;
          e[5] = 0x23;
          e[6] = -2;
          e[9] = GetRegister_lastIxyD;
          e[2] = GetRegister_lastIxyD;
          e[4] = e[0];
          e[7] = e[0];
          e[10] = e[3];
          e[0xb] = e[0];
          ZVar4 = GetRegister_r16Low(ZVar5);
          e[1] = ZVar4 + (Z80_SP|Z80_HL);
          ZVar4 = GetRegister_r16High(ZVar5);
          e[8] = ZVar4 + (Z80_SP|Z80_HL);
          break;
        case Z80_UNK:
          Options::noFakes(true);
          e[0] = ZVar4 & 0xff;
          e._20_8_ = CONCAT44(e[6],ZVar4) & 0xffffffff000000ff;
          e[1] = 0x36;
          e[2] = GetRegister_lastIxyD;
          bVar2 = GetByteNoMem((char **)0x0,(bool)signedCheck);
          e[3] = (int)bVar2;
          e[4] = -2;
          e[6] = 0x23;
          break;
        default:
          if ((ZVar5 == Z80_DE) || (ZVar5 == Z80_HL)) goto switchD_00133fde_caseD_10;
        }
      }
    }
    in_RSI = 1;
    EmitBytes(e,true);
    ppcVar8 = &lp;
    cVar3 = (*DAT_0018a520)();
    if (cVar3 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_LDI() {
		if (Options::noFakes(false)) {
			EmitByte(0xED, true);
			EmitByte(0xA0);
			return;
		}

		// only when fakes are enabled (but they may be silent/warning enabled, so extra checks needed)
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1 };
			Z80Reg reg2 = Z80_UNK, reg = GetRegister(lp);
			switch (reg) {
			case Z80_A:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg = GetRegister(lp)) {
				case Z80_BC:	// 0A 03
				case Z80_DE:	// 1A 13
					if (CloseBracket(lp)) e[0] = reg - Z80_BC + 0x0a;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = reg - Z80_BC + 0x03;
					break;
				case Z80_HL:
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;
					if (CloseBracket(lp)) e[0] = 0x7e;
					break;
				case Z80_IX:
				case Z80_IY:
					e[3] = INSTRUCTION_START_MARKER;
					e[1] = 0x7e; e[5] = 0x23; e[2] = z80GetIDxoffset(lp);
					if (CloseBracket(lp)) e[0] = e[4] = reg;
					break;
				default:
					break;
				}
				break;
			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg2 = GetRegister(lp)) {
				case Z80_HL:
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23; if (CloseBracket(lp)) e[0] = 0x46 + reg * 8;
					break;
				case Z80_IX:
				case Z80_IY:
					e[3] = INSTRUCTION_START_MARKER;
					e[1] = 0x46 + reg * 8; e[5] = 0x23; e[2] = z80GetIDxoffset(lp);
					if (CloseBracket(lp)) e[0] = e[4] = reg2;
					break;
				default:
					break;
				}
				break;
			case Z80_BC: case Z80_DE: case Z80_HL:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:
					if (Z80_HL == reg) break;
					Options::noFakes();		// to display warning if "-f"
					e[1] = e[3] = e[5] = INSTRUCTION_START_MARKER;
					e[0] = 0x3e + reg;
					e[2] = 0x23;
					e[4] = 0x36 + reg;
					e[6] = 0x23;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:
					Options::noFakes();		// to display warning if "-f"
					e[3] = e[6] = e[10] = INSTRUCTION_START_MARKER;
					e[2] = e[9] = GetRegister_lastIxyD;
					e[0] = e[4] = e[7] = e[11] = reg2&0xFF;
					e[1] = 0x3e + reg; e[8] = 0x36 + reg; e[5] = e[12] = 0x23;
					break;
				default:
					break;
				}
				break;
			case Z80_MEM_HL:
				if (!comma(lp)) break;
				switch (reg = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[1] = INSTRUCTION_START_MARKER;
					e[0] = 0x70 + reg; e[2] = 0x23; break;
				case Z80_BC: case Z80_DE:
					Options::noFakes();		// to display warning if "-f"
					e[1] = e[3] = e[5] = INSTRUCTION_START_MARKER;
					e[0] = 0x70 + GetRegister_r16Low(reg); e[4] = 0x70 + GetRegister_r16High(reg);
					e[2] = e[6] = 0x23; break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[2] = INSTRUCTION_START_MARKER;
					e[0] = 0x36; e[1] = GetByteNoMem(lp); e[3] = 0x23; break;
				default:
					break;
				}
				break;
			case Z80_MEM_IX: case Z80_MEM_IY:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[3] = INSTRUCTION_START_MARKER;
					e[0] = e[4] = reg&0xFF; e[2] = GetRegister_lastIxyD; e[1] = 0x70 + reg2; e[5] = 0x23; break;
				case Z80_BC: case Z80_DE: case Z80_HL:
					Options::noFakes();		// to display warning if "-f"
					e[3] = e[6] = e[10] = INSTRUCTION_START_MARKER;
					e[0] = e[4] = e[7] = e[11] = reg&0xFF; e[5] = e[12] = 0x23; e[2] = e[9] = GetRegister_lastIxyD;
					e[1] = 0x70 + GetRegister_r16Low(reg2); e[8] = 0x70 + GetRegister_r16High(reg2); break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[5] = reg&0xFF; e[1] = 0x36; e[2] = GetRegister_lastIxyD; e[3] = GetByteNoMem(lp);
					e[4] = INSTRUCTION_START_MARKER;
					e[6] = 0x23; break;
				default:
					break;
				}
				break;
			default:
				if (BT_NONE != OpenBracket(lp)) {
					reg = GetRegister(lp);
					if (!CloseBracket(lp) || !comma(lp)) break;
					if ((Z80_BC != reg && Z80_DE != reg) || Z80_A != GetRegister(lp)) break;
					Options::noFakes();
					e[1] = INSTRUCTION_START_MARKER;
					e[0] = reg - 14; e[2] = reg - 13;	// LDI (bc|de),a
				} else {
					e[0] = 0xed; e[1] = 0xa0;			// regular LDI
				}
			}

			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}